

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

bool __thiscall ImportBaseDirWrapper::wrap(ImportBaseDirWrapper *this)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  IMAGE_DATA_DIRECTORY *pIVar4;
  reference ppEVar5;
  ExeNodeWrapper *entry;
  size_t invalidSeries;
  size_t cntr;
  size_t INVALID_LIMIT;
  size_t LIMIT;
  size_t oldCount;
  ImportBaseDirWrapper *this_local;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])();
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  sVar1 = this->importsCount;
  this->importsCount = 0;
  this->invalidEntries = 0;
  pIVar4 = DataDirEntryWrapper::getDataDirectory(&this->super_DataDirEntryWrapper);
  if (pIVar4 == (IMAGE_DATA_DIRECTORY *)0x0) {
    sVar2 = this->importsCount;
  }
  else {
    entry = (ExeNodeWrapper *)0x0;
    invalidSeries = 0;
    while ((invalidSeries != 0xffffffffffffffff &&
           (uVar3 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer
                      [0x2e])(this,invalidSeries), (uVar3 & 1) != 0))) {
      ppEVar5 = std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::at
                          (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.
                            super_ExeNodeWrapper.entries,invalidSeries);
      if (*ppEVar5 == (value_type)0x0) break;
      uVar3 = (*((*ppEVar5)->super_ExeElementWrapper).super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x2b])();
      if ((uVar3 & 1) == 0) {
        entry = (ExeNodeWrapper *)
                ((long)&(entry->super_ExeElementWrapper).super_AbstractByteBuffer.
                        _vptr_AbstractByteBuffer + 1);
        this->invalidEntries = this->invalidEntries + 1;
        if ((ExeNodeWrapper *)0x63 < entry) break;
      }
      else {
        entry = (ExeNodeWrapper *)0x0;
      }
      invalidSeries = invalidSeries + 1;
    }
    this->importsCount = invalidSeries;
    sVar2 = this->importsCount;
  }
  this_local._7_1_ = sVar1 != sVar2;
  return this_local._7_1_;
}

Assistant:

bool ImportBaseDirWrapper::wrap()
{
    clearMapping();
    clear();

    size_t oldCount = this->importsCount;
    this->importsCount = 0;
    this->invalidEntries = 0;
    
    if (!getDataDirectory()) {
        return (oldCount != this->importsCount); //has count changed
    }

    const size_t LIMIT = (-1);
    const size_t INVALID_LIMIT = 100;
    size_t cntr = 0;
    size_t invalidSeries = 0;
    for (cntr = 0; cntr < LIMIT; cntr++) {
        if (loadNextEntry(cntr) == false) break;
        ExeNodeWrapper* entry = this->entries.at(cntr);
        if (!entry) break;
        if (entry->isValid()) {
            invalidSeries = 0;
        }
        else {
            invalidSeries++;
            this->invalidEntries++;
            if (invalidSeries >= INVALID_LIMIT) break;
        }
    }

    this->importsCount = cntr;
    return (oldCount != this->importsCount); //has count changed
}